

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::
SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,void>>::Task,10ul>
::
emplace_back<void(*&)(wasm::(anonymous_namespace)::Heap2LocalPass*,wasm::Expression**),wasm::Expression**&>
          (SmallVector<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,void>>::Task,10ul>
           *this,_func_void_Heap2LocalPass_ptr_Expression_ptr_ptr **Args,Expression ***Args_1)

{
  Expression **ppEVar1;
  _Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
  *p_Var2;
  pointer pTVar3;
  pointer *this_00;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 *puVar6;
  pointer *__n;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = *(ulong *)this;
  if (uVar5 < 10) {
    *(ulong *)this = uVar5 + 1;
    ppEVar1 = *Args_1;
    *(_func_void_Heap2LocalPass_ptr_Expression_ptr_ptr **)(this + uVar5 * 0x10 + 8) = *Args;
    *(Expression ***)(this + uVar5 * 0x10 + 0x10) = ppEVar1;
  }
  else {
    p_Var2 = *(_Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
               **)(this + 0xb0);
    if (p_Var2 == *(_Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
                    **)(this + 0xb8)) {
      this_00 = *(pointer **)(this + 0xa8);
      if ((long)p_Var2 - (long)this_00 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = (long)p_Var2 - (long)this_00 >> 4;
      uVar5 = 1;
      if (p_Var2 != (_Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
                     *)this_00) {
        uVar5 = uVar8;
      }
      uVar7 = uVar5 + uVar8;
      if (0x7fffffffffffffe < uVar7) {
        uVar7 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar5,uVar8)) {
        uVar7 = 0x7ffffffffffffff;
      }
      if (uVar7 == 0) {
        puVar6 = (undefined8 *)0x0;
      }
      else {
        puVar6 = (undefined8 *)operator_new(uVar7 << 4);
      }
      ppEVar1 = *Args_1;
      puVar6[uVar8 * 2] = *Args;
      puVar6[uVar8 * 2 + 1] = ppEVar1;
      puVar4 = puVar6;
      for (__n = this_00;
          (_Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
           *)__n != p_Var2; __n = __n + 2) {
        pTVar3 = __n[1];
        *puVar4 = *__n;
        puVar4[1] = pTVar3;
        puVar4 = puVar4 + 2;
      }
      std::
      _Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
      ::_M_deallocate((_Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>::Task>_>
                       *)this_00,(pointer)(*(long *)(this + 0xb8) - (long)this_00 >> 4),(size_t)__n)
      ;
      *(undefined8 **)(this + 0xa8) = puVar6;
      *(undefined8 **)(this + 0xb0) = puVar4 + 2;
      *(undefined8 **)(this + 0xb8) = puVar6 + uVar7 * 2;
    }
    else {
      pTVar3 = (pointer)*Args_1;
      (p_Var2->_M_impl).super__Vector_impl_data._M_start = (pointer)*Args;
      (p_Var2->_M_impl).super__Vector_impl_data._M_finish = pTVar3;
      *(pointer **)(this + 0xb0) = &(p_Var2->_M_impl).super__Vector_impl_data._M_end_of_storage;
    }
  }
  return;
}

Assistant:

void emplace_back(ArgTypes&&... Args) {
    if (usedFixed < N) {
      new (&fixed[usedFixed++]) T(std::forward<ArgTypes>(Args)...);
    } else {
      flexible.emplace_back(std::forward<ArgTypes>(Args)...);
    }
  }